

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svd22.c
# Opt level: O0

void svd_sym_singular_values(double A00,double A01,double A11,double *Lmin,double *Lmax)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double f;
  double e;
  double C1;
  double SPpT;
  double CPpT;
  double C0;
  double SPmT;
  double CPmT;
  double T;
  double P;
  double PplusT;
  double PminusT;
  double B3;
  double B2;
  double B1;
  double B0;
  double A10;
  double *Lmax_local;
  double *Lmin_local;
  double A11_local;
  double A01_local;
  double A00_local;
  
  dVar1 = atan2(A01 - A01,A00 + A11);
  dVar2 = atan2(A01 + A01,A00 - A11);
  dVar3 = (dVar1 + dVar2) / 2.0;
  dVar1 = (-dVar1 + dVar2) / 2.0;
  dVar2 = cos(dVar3 - dVar1);
  dVar4 = sin(dVar3 - dVar1);
  if (ABS(dVar2) <= ABS(dVar4)) {
    CPpT = (A01 - A01) / dVar4;
  }
  else {
    CPpT = (A00 + A11) / dVar2;
  }
  dVar2 = cos(dVar3 + dVar1);
  dVar1 = sin(dVar3 + dVar1);
  if (ABS(dVar2) <= ABS(dVar1)) {
    e = (A01 + A01) / dVar1;
  }
  else {
    e = (A00 - A11) / dVar2;
  }
  dVar2 = (CPpT + e) / 2.0;
  dVar3 = (CPpT - e) / 2.0;
  dVar1 = dVar3;
  if (dVar2 <= dVar3) {
    dVar1 = dVar2;
  }
  *Lmin = (double)(~-(ulong)NAN(dVar2) & (ulong)dVar1 | -(ulong)NAN(dVar2) & (ulong)dVar3);
  dVar1 = dVar3;
  if (dVar3 <= dVar2) {
    dVar1 = dVar2;
  }
  *Lmax = (double)(~-(ulong)NAN(dVar2) & (ulong)dVar1 | -(ulong)NAN(dVar2) & (ulong)dVar3);
  return;
}

Assistant:

void svd_sym_singular_values(double A00, double A01, double A11,
                             double *Lmin, double *Lmax)
{
    double A10 = A01;

    double B0 = A00 + A11;
    double B1 = A00 - A11;
    double B2 = A01 + A10;
    double B3 = A01 - A10;

    double PminusT = atan2(B3, B0);
    double PplusT = atan2(B2, B1);

    double P = (PminusT + PplusT) / 2;
    double T = (-PminusT + PplusT) / 2;

    // C0 = e+f. There are two ways to compute C0; we pick the one
    // that is better conditioned.
    double CPmT = cos(P-T), SPmT = sin(P-T);
    double C0 = 0;
    if (fabs(CPmT) > fabs(SPmT))
        C0 = B0 / CPmT;
    else
        C0 = B3 / SPmT;

    // C1 = e-f. There are two ways to compute C1; we pick the one
    // that is better conditioned.
    double CPpT = cos(P+T), SPpT = sin(P+T);
    double C1 = 0;
    if (fabs(CPpT) > fabs(SPpT))
        C1 = B1 / CPpT;
    else
        C1 = B2 / SPpT;

    // e and f are the singular values
    double e = (C0 + C1) / 2;
    double f = (C0 - C1) / 2;

    *Lmin = fmin(e, f);
    *Lmax = fmax(e, f);
}